

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void __thiscall ncnn::Mat::substract_mean_normalize(Mat *this,float *mean_vals,float *norm_vals)

{
  int *piVar1;
  void *pvVar2;
  long *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Mat *pMVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  Layer *pLVar12;
  long lVar13;
  void *ptr;
  Option opt;
  ModelBinFromMatArray local_a08;
  undefined4 uStack_9f8;
  undefined4 uStack_9f4;
  int iStack_9f0;
  Allocator *local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  size_t sStack_9d0;
  _func_int **local_9c0;
  Mat local_9b8;
  _func_int **local_978;
  undefined8 uStack_970;
  undefined4 uStack_968;
  undefined4 uStack_964;
  undefined4 uStack_960;
  Allocator *local_958;
  undefined4 local_950;
  undefined4 uStack_94c;
  undefined4 uStack_948;
  undefined4 uStack_944;
  long local_940;
  ParamDict local_930;
  
  if (norm_vals == (float *)0x0 && mean_vals != (float *)0x0) {
    pLVar12 = create_layer(3);
    ParamDict::ParamDict(&local_930);
    ParamDict::set(&local_930,0,this->c);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_930);
    local_9b8.elemsize._0_4_ = 0;
    local_9b8.elemsize._4_4_ = 0;
    local_9b8.elempack = 0;
    local_9b8.data = (void *)0x0;
    local_9b8.refcount._0_4_ = 0;
    local_9b8.refcount._4_4_ = 0;
    local_9b8.allocator = (Allocator *)0x0;
    local_9b8.dims = 0;
    local_9b8.w = 0;
    local_9b8.h = 0;
    local_9b8.c = 0;
    local_9b8.cstep = 0;
    uStack_9e0._4_4_ = this->c;
    sStack_9d0 = (size_t)uStack_9e0._4_4_;
    local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
    local_a08.weights._0_4_ = 0;
    local_a08.weights._4_4_ = 0;
    local_a08.weights = (Mat *)0x0;
    uStack_9f8 = 4;
    uStack_9f4 = 0;
    iStack_9f0 = 1;
    local_9e8 = (Allocator *)0x0;
    uStack_9e0._0_4_ = 1;
    local_9d8._0_4_ = 1;
    local_9d8._4_4_ = 1;
    if (uStack_9e0._4_4_ != 0) {
      lVar13 = sStack_9d0 * 4;
      local_9c0 = (_func_int **)0x0;
      iVar11 = posix_memalign(&local_9c0,0x10,sStack_9d0 * 4 + 4);
      if (iVar11 != 0) {
        local_9c0 = (_func_int **)0x0;
      }
      local_a08.super_ModelBin._vptr_ModelBin = local_9c0;
      local_a08.weights = (Mat *)((long)local_9c0 + lVar13);
      *(undefined4 *)((long)local_9c0 + lVar13) = 1;
    }
    if (local_a08.weights != (Mat *)0x0) {
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_9b8.refcount._4_4_,local_9b8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_9b8.allocator == (Allocator *)0x0) {
          if (local_9b8.data != (void *)0x0) {
            free(local_9b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_9b8.allocator + 0x18))();
        }
      }
    }
    local_9b8.data = local_a08.super_ModelBin._vptr_ModelBin;
    local_9b8.elemsize._0_4_ = uStack_9f8;
    local_9b8.elemsize._4_4_ = uStack_9f4;
    local_9b8.elempack = iStack_9f0;
    local_9b8.allocator = local_9e8;
    uVar7._0_4_ = (int)uStack_9e0;
    uVar7._4_4_ = uStack_9e0._4_4_;
    local_9b8.dims = (int)uStack_9e0;
    local_9b8.w = uStack_9e0._4_4_;
    uVar9._0_4_ = (int)local_9d8;
    uVar9._4_4_ = local_9d8._4_4_;
    local_9b8.h = (int)local_9d8;
    local_9b8.c = local_9d8._4_4_;
    local_9b8.cstep = sStack_9d0;
    uVar8 = uVar7;
    uVar10 = uVar9;
    local_9b8.refcount = (int *)local_a08.weights;
    if (local_a08.weights != (Mat *)0x0) {
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + -1;
      UNLOCK();
      uVar8 = local_9b8._40_8_;
      uVar10 = local_9b8._48_8_;
      if (*(int *)&(local_a08.weights)->data == 0) {
        if (local_9e8 == (Allocator *)0x0) {
          if (local_a08.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
            local_9b8._40_8_ = uVar7;
            local_9b8._48_8_ = uVar9;
            free(local_a08.super_ModelBin._vptr_ModelBin);
            uVar8 = local_9b8._40_8_;
            uVar10 = local_9b8._48_8_;
          }
        }
        else {
          local_9b8._40_8_ = uVar7;
          local_9b8._48_8_ = uVar9;
          (**(code **)(*(long *)local_9e8 + 0x18))();
          uVar8 = local_9b8._40_8_;
          uVar10 = local_9b8._48_8_;
          local_9b8.refcount = local_9b8.refcount;
        }
      }
    }
    local_9b8._48_8_ = uVar10;
    local_9b8._40_8_ = uVar8;
    uStack_9f8 = 0;
    uStack_9f4 = 0;
    iStack_9f0 = 0;
    local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
    local_a08.weights._0_4_ = 0;
    local_a08.weights._4_4_ = 0;
    uStack_9e0 = 0;
    local_9d8 = 0;
    sStack_9d0 = 0;
    iVar11 = this->c;
    if (0 < (long)iVar11) {
      lVar13 = 0;
      do {
        *(float *)((long)local_9b8.data + lVar13 * 4) = -mean_vals[lVar13];
        lVar13 = lVar13 + 1;
      } while (iVar11 != lVar13);
    }
    ModelBinFromMatArray::ModelBinFromMatArray(&local_a08,&local_9b8);
    (*pLVar12->_vptr_Layer[3])(pLVar12,&local_a08);
    ModelBin::~ModelBin(&local_a08.super_ModelBin);
    if ((Mat *)local_9b8.refcount != (Mat *)0x0) {
      LOCK();
      *(int *)(void **)local_9b8.refcount = *(int *)(void **)local_9b8.refcount + -1;
      UNLOCK();
      if (*(int *)(void **)local_9b8.refcount == 0) {
        if (local_9b8.allocator == (Allocator *)0x0) {
          if ((_func_int **)local_9b8.data != (_func_int **)0x0) {
            free(local_9b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_9b8.allocator + 0x18))();
        }
      }
    }
    lVar13 = 0x8c0;
    do {
      piVar1 = *(int **)((long)&local_930.params[0].v.data + lVar13);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = *(void **)((long)&local_930.params[0].type + lVar13);
          plVar3 = *(long **)((long)&local_930.params[0].v.elempack + lVar13);
          if (plVar3 == (long *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar13 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar13 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].type + lVar13) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar13) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar13) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.dims + lVar13) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.h + lVar13) = 0;
      lVar13 = lVar13 + -0x48;
    } while (lVar13 != -0x40);
  }
  else if (mean_vals == (float *)0x0 && norm_vals != (float *)0x0) {
    pLVar12 = create_layer(0x1d);
    ParamDict::ParamDict(&local_930);
    ParamDict::set(&local_930,0,this->c);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_930);
    uStack_9e0._4_4_ = this->c;
    local_9b8.cstep = 0;
    local_9b8.h = 0;
    local_9b8.c = 0;
    local_9b8.dims = 0;
    local_9b8.w = 0;
    local_9b8.allocator = (Allocator *)0x0;
    local_9b8.elempack = 0;
    local_9b8.elemsize._4_4_ = 0;
    local_9b8.elemsize._0_4_ = 0;
    local_9b8.refcount._4_4_ = 0;
    local_9b8.refcount._0_4_ = 0;
    local_9b8.data = (void *)0x0;
    sStack_9d0 = (size_t)uStack_9e0._4_4_;
    local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
    local_a08.weights._0_4_ = 0;
    local_a08.weights._4_4_ = 0;
    local_a08.weights = (Mat *)0x0;
    uStack_9f8 = 4;
    uStack_9f4 = 0;
    iStack_9f0 = 1;
    local_9e8 = (Allocator *)0x0;
    uStack_9e0._0_4_ = 1;
    local_9d8._0_4_ = 1;
    local_9d8._4_4_ = 1;
    if (uStack_9e0._4_4_ != 0) {
      lVar13 = sStack_9d0 * 4;
      local_9c0 = (_func_int **)0x0;
      iVar11 = posix_memalign(&local_9c0,0x10,sStack_9d0 * 4 + 4);
      if (iVar11 != 0) {
        local_9c0 = (_func_int **)0x0;
      }
      local_a08.super_ModelBin._vptr_ModelBin = local_9c0;
      local_a08.weights = (Mat *)((long)local_9c0 + lVar13);
      *(undefined4 *)((long)local_9c0 + lVar13) = 1;
    }
    if (local_a08.weights != (Mat *)0x0) {
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_9b8.refcount._4_4_,local_9b8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_9b8.allocator == (Allocator *)0x0) {
          if (local_9b8.data != (void *)0x0) {
            free(local_9b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_9b8.allocator + 0x18))();
        }
      }
    }
    local_9b8.data = local_a08.super_ModelBin._vptr_ModelBin;
    local_9b8.elemsize._0_4_ = uStack_9f8;
    local_9b8.elemsize._4_4_ = uStack_9f4;
    local_9b8.elempack = iStack_9f0;
    local_9b8.allocator = local_9e8;
    uVar4._0_4_ = (int)uStack_9e0;
    uVar4._4_4_ = uStack_9e0._4_4_;
    local_9b8.dims = (int)uStack_9e0;
    local_9b8.w = uStack_9e0._4_4_;
    uVar5._0_4_ = (int)local_9d8;
    uVar5._4_4_ = local_9d8._4_4_;
    local_9b8.h = (int)local_9d8;
    local_9b8.c = local_9d8._4_4_;
    local_9b8.cstep = sStack_9d0;
    uVar7 = uVar4;
    uVar9 = uVar5;
    local_9b8.refcount = (int *)local_a08.weights;
    if (local_a08.weights != (Mat *)0x0) {
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + -1;
      UNLOCK();
      uVar7 = local_9b8._40_8_;
      uVar9 = local_9b8._48_8_;
      if (*(int *)&(local_a08.weights)->data == 0) {
        if (local_9e8 == (Allocator *)0x0) {
          if (local_a08.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
            local_9b8._40_8_ = uVar4;
            local_9b8._48_8_ = uVar5;
            free(local_a08.super_ModelBin._vptr_ModelBin);
            uVar7 = local_9b8._40_8_;
            uVar9 = local_9b8._48_8_;
          }
        }
        else {
          local_9b8._40_8_ = uVar4;
          local_9b8._48_8_ = uVar5;
          (**(code **)(*(long *)local_9e8 + 0x18))();
          uVar7 = local_9b8._40_8_;
          uVar9 = local_9b8._48_8_;
          local_9b8.refcount = local_9b8.refcount;
        }
      }
    }
    local_9b8._48_8_ = uVar9;
    local_9b8._40_8_ = uVar7;
    uStack_9f8 = 0;
    uStack_9f4 = 0;
    iStack_9f0 = 0;
    local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
    local_a08.weights._0_4_ = 0;
    local_a08.weights._4_4_ = 0;
    uStack_9e0 = 0;
    local_9d8 = 0;
    sStack_9d0 = 0;
    iVar11 = this->c;
    if (0 < (long)iVar11) {
      lVar13 = 0;
      do {
        *(float *)((long)local_9b8.data + lVar13 * 4) = norm_vals[lVar13];
        lVar13 = lVar13 + 1;
      } while (iVar11 != lVar13);
    }
    ModelBinFromMatArray::ModelBinFromMatArray(&local_a08,&local_9b8);
    (*pLVar12->_vptr_Layer[3])(pLVar12,&local_a08);
    ModelBin::~ModelBin(&local_a08.super_ModelBin);
    if ((Mat *)local_9b8.refcount != (Mat *)0x0) {
      LOCK();
      *(int *)(void **)local_9b8.refcount = *(int *)(void **)local_9b8.refcount + -1;
      UNLOCK();
      if (*(int *)(void **)local_9b8.refcount == 0) {
        if (local_9b8.allocator == (Allocator *)0x0) {
          if ((_func_int **)local_9b8.data != (_func_int **)0x0) {
            free(local_9b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_9b8.allocator + 0x18))();
        }
      }
    }
    lVar13 = 0x8c0;
    do {
      piVar1 = *(int **)((long)&local_930.params[0].v.data + lVar13);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = *(void **)((long)&local_930.params[0].type + lVar13);
          plVar3 = *(long **)((long)&local_930.params[0].v.elempack + lVar13);
          if (plVar3 == (long *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar13 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar13 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].type + lVar13) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar13) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar13) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.dims + lVar13) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.h + lVar13) = 0;
      lVar13 = lVar13 + -0x48;
    } while (lVar13 != -0x40);
  }
  else {
    if (mean_vals == (float *)0x0 || norm_vals == (float *)0x0) {
      return;
    }
    pLVar12 = create_layer(0x1d);
    ParamDict::ParamDict(&local_930);
    ParamDict::set(&local_930,0,this->c);
    ParamDict::set(&local_930,1,1);
    (*pLVar12->_vptr_Layer[2])(pLVar12);
    lVar13 = 0;
    do {
      *(undefined8 *)((long)&local_9b8.refcount + lVar13 + 4) = 0;
      *(undefined8 *)((long)&local_9b8.elemsize + lVar13 + 4) = 0;
      *(undefined8 *)((long)&local_9b8.data + lVar13) = 0;
      *(undefined8 *)((long)&local_9b8.refcount + lVar13) = 0;
      *(undefined8 *)((long)&local_9b8.allocator + lVar13) = 0;
      *(undefined8 *)((long)&local_9b8.dims + lVar13) = 0;
      *(undefined8 *)((long)&local_9b8.h + lVar13) = 0;
      *(undefined8 *)((long)&local_9b8.cstep + lVar13) = 0;
      lVar13 = lVar13 + 0x40;
    } while (lVar13 != 0x80);
    uStack_9e0._4_4_ = this->c;
    sStack_9d0 = (size_t)uStack_9e0._4_4_;
    local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
    local_a08.weights._0_4_ = 0;
    local_a08.weights._4_4_ = 0;
    local_a08.weights = (Mat *)0x0;
    uStack_9f8 = 4;
    uStack_9f4 = 0;
    iStack_9f0 = 1;
    local_9e8 = (Allocator *)0x0;
    uStack_9e0._0_4_ = 1;
    local_9d8._0_4_ = 1;
    local_9d8._4_4_ = 1;
    if (uStack_9e0._4_4_ != 0) {
      lVar13 = sStack_9d0 * 4;
      local_9c0 = (_func_int **)0x0;
      iVar11 = posix_memalign(&local_9c0,0x10,sStack_9d0 * 4 + 4);
      if (iVar11 != 0) {
        local_9c0 = (_func_int **)0x0;
      }
      local_a08.super_ModelBin._vptr_ModelBin = local_9c0;
      local_a08.weights = (Mat *)((long)local_9c0 + lVar13);
      *(undefined4 *)((long)local_9c0 + lVar13) = 1;
    }
    if (local_a08.weights != (Mat *)0x0) {
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_9b8.refcount._4_4_,local_9b8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_9b8.allocator == (Allocator *)0x0) {
          if (local_9b8.data != (void *)0x0) {
            free(local_9b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_9b8.allocator + 0x18))();
        }
      }
    }
    local_9b8.data = local_a08.super_ModelBin._vptr_ModelBin;
    local_9b8.elemsize._0_4_ = uStack_9f8;
    local_9b8.elemsize._4_4_ = uStack_9f4;
    local_9b8.elempack = iStack_9f0;
    local_9b8.allocator = local_9e8;
    uVar8._0_4_ = (int)uStack_9e0;
    uVar8._4_4_ = uStack_9e0._4_4_;
    local_9b8.dims = (int)uStack_9e0;
    local_9b8.w = uStack_9e0._4_4_;
    uVar10._0_4_ = (int)local_9d8;
    uVar10._4_4_ = local_9d8._4_4_;
    local_9b8.h = (int)local_9d8;
    local_9b8.c = local_9d8._4_4_;
    local_9b8.cstep = sStack_9d0;
    uVar7 = uVar8;
    uVar9 = uVar10;
    local_9b8.refcount = (int *)local_a08.weights;
    if (local_a08.weights != (Mat *)0x0) {
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + -1;
      UNLOCK();
      uVar7 = local_9b8._40_8_;
      uVar9 = local_9b8._48_8_;
      if (*(int *)&(local_a08.weights)->data == 0) {
        if (local_9e8 == (Allocator *)0x0) {
          if (local_a08.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
            local_9b8._40_8_ = uVar8;
            local_9b8._48_8_ = uVar10;
            free(local_a08.super_ModelBin._vptr_ModelBin);
            uVar7 = local_9b8._40_8_;
            uVar9 = local_9b8._48_8_;
          }
        }
        else {
          local_9b8._40_8_ = uVar8;
          local_9b8._48_8_ = uVar10;
          (**(code **)(*(long *)local_9e8 + 0x18))();
          uVar7 = local_9b8._40_8_;
          uVar9 = local_9b8._48_8_;
          local_9b8.refcount = local_9b8.refcount;
        }
      }
    }
    local_9b8._48_8_ = uVar9;
    local_9b8._40_8_ = uVar7;
    iVar11 = this->c;
    sStack_9d0 = (size_t)iVar11;
    local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
    local_a08.weights._0_4_ = 0;
    local_a08.weights._4_4_ = 0;
    local_a08.weights = (Mat *)0x0;
    uStack_9f8 = 4;
    uStack_9f4 = 0;
    iStack_9f0 = 1;
    local_9e8 = (Allocator *)0x0;
    uStack_9e0 = CONCAT44(iVar11,1);
    local_9d8 = 0x100000001;
    if (iVar11 != 0) {
      lVar13 = sStack_9d0 * 4;
      local_9c0 = (_func_int **)0x0;
      iVar11 = posix_memalign(&local_9c0,0x10,sStack_9d0 * 4 + 4);
      if (iVar11 != 0) {
        local_9c0 = (_func_int **)0x0;
      }
      local_a08.super_ModelBin._vptr_ModelBin = local_9c0;
      local_a08.weights = (Mat *)((long)local_9c0 + lVar13);
      *(undefined4 *)((long)local_9c0 + lVar13) = 1;
    }
    if (local_a08.weights != (Mat *)0x0) {
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(uStack_970._4_4_,(undefined4)uStack_970);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_958 == (Allocator *)0x0) {
          if (local_978 != (_func_int **)0x0) {
            free(local_978);
          }
        }
        else {
          (**(code **)(*(long *)local_958 + 0x18))();
        }
      }
    }
    local_978 = local_a08.super_ModelBin._vptr_ModelBin;
    uStack_968 = uStack_9f8;
    uStack_964 = uStack_9f4;
    uStack_960 = iStack_9f0;
    local_958 = local_9e8;
    local_950 = (int)uStack_9e0;
    uStack_94c = uStack_9e0._4_4_;
    uStack_948 = (int)local_9d8;
    uStack_944 = local_9d8._4_4_;
    local_940 = sStack_9d0;
    uStack_970 = local_a08.weights;
    if (local_a08.weights != (Mat *)0x0) {
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + -1;
      UNLOCK();
      if (*(int *)&(local_a08.weights)->data == 0) {
        if (local_9e8 == (Allocator *)0x0) {
          if (local_a08.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
            free(local_a08.super_ModelBin._vptr_ModelBin);
          }
        }
        else {
          (**(code **)(*(long *)local_9e8 + 0x18))();
          uStack_970 = uStack_970;
        }
      }
    }
    uStack_9f8 = 0;
    uStack_9f4 = 0;
    iStack_9f0 = 0;
    local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
    local_a08.weights._0_4_ = 0;
    local_a08.weights._4_4_ = 0;
    uStack_9e0 = 0;
    local_9d8 = 0;
    sStack_9d0 = 0;
    iVar11 = this->c;
    if (0 < (long)iVar11) {
      lVar13 = 0;
      do {
        *(float *)((long)local_9b8.data + lVar13 * 4) = norm_vals[lVar13];
        *(float *)((long)local_978 + lVar13 * 4) = -mean_vals[lVar13] * norm_vals[lVar13];
        lVar13 = lVar13 + 1;
      } while (iVar11 != lVar13);
    }
    ModelBinFromMatArray::ModelBinFromMatArray(&local_a08,&local_9b8);
    (*pLVar12->_vptr_Layer[3])(pLVar12,&local_a08);
    ModelBin::~ModelBin(&local_a08.super_ModelBin);
    lVar13 = 0x40;
    do {
      piVar1 = *(int **)((long)&local_9b8.refcount + lVar13);
      pMVar6 = (Mat *)local_9b8.refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = *(void **)((long)&local_9b8.data + lVar13);
          plVar3 = *(long **)((long)&local_9b8.allocator + lVar13);
          if (plVar3 == (long *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
              pMVar6 = (Mat *)local_9b8.refcount;
            }
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
            pMVar6 = (Mat *)local_9b8.refcount;
          }
        }
      }
      local_9b8.refcount._4_4_ = (undefined4)((ulong)pMVar6 >> 0x20);
      local_9b8.refcount._0_4_ = SUB84(pMVar6,0);
      *(undefined8 *)((long)&local_9b8.refcount + lVar13 + 4) = 0;
      *(undefined8 *)((long)&local_9b8.elemsize + lVar13 + 4) = 0;
      *(undefined8 *)((long)&local_9b8.data + lVar13) = 0;
      *(undefined8 *)((long)&local_9b8.refcount + lVar13) = 0;
      *(undefined8 *)((long)&local_9b8.dims + lVar13) = 0;
      *(undefined8 *)((long)&local_9b8.h + lVar13) = 0;
      *(undefined8 *)((long)&local_9b8.cstep + lVar13) = 0;
      lVar13 = lVar13 + -0x40;
    } while (lVar13 != -0x40);
    lVar13 = 0x8c0;
    do {
      piVar1 = *(int **)((long)&local_930.params[0].v.data + lVar13);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = *(void **)((long)&local_930.params[0].type + lVar13);
          plVar3 = *(long **)((long)&local_930.params[0].v.elempack + lVar13);
          if (plVar3 == (long *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar13 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar13 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].type + lVar13) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar13) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar13) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.dims + lVar13) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.h + lVar13) = 0;
      lVar13 = lVar13 + -0x48;
    } while (lVar13 != -0x40);
  }
  Option::Option((Option *)&local_930);
  local_930.params[0].field_1.i = 1;
  (*pLVar12->_vptr_Layer[4])(pLVar12,(Option *)&local_930);
  (*pLVar12->_vptr_Layer[9])(pLVar12,this,(Option *)&local_930);
  (*pLVar12->_vptr_Layer[5])(pLVar12,(Option *)&local_930);
  (*pLVar12->_vptr_Layer[1])(pLVar12);
  return;
}

Assistant:

void Mat::substract_mean_normalize(const float* mean_vals, const float* norm_vals)
{
    Layer* op;

    if (mean_vals && !norm_vals)
    {
        // substract mean only
        op = create_layer(LayerType::Bias);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q=0; q<c; q++)
        {
            weights[0][q] = -mean_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (!mean_vals && norm_vals)
    {
        // normalize only
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q=0; q<c; q++)
        {
            weights[0][q] = norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (mean_vals && norm_vals)
    {
        // substract mean and normalize
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);
        pd.set(1, 1);

        op->load_param(pd);

        Mat weights[2];
        weights[0] = Mat(c);
        weights[1] = Mat(c);
        for (int q=0; q<c; q++)
        {
            weights[0][q] = norm_vals[q];
            weights[1][q] = - mean_vals[q] * norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else // if (!mean_vals && !norm_vals)
    {
        return;
    }

    Option opt;
    opt.num_threads = 1;// TODO

    op->create_pipeline(opt);

    op->forward_inplace(*this, opt);

    op->destroy_pipeline(opt);

    delete op;
}